

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastUmS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  MicroString *str;
  ushort *puVar4;
  ulong uVar5;
  char *pcVar6;
  uint *puVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 arena;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  TcParseTableBase *ptr_00;
  ulong hasbits_00;
  string_view sVar8;
  string_view str_00;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar6 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar6;
  }
  bVar1 = *ptr;
  str = RefAt<google::protobuf::internal::MicroString>(msg,(ulong)data.field_0 >> 0x30);
  arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)(msg->_internal_metadata_).ptr_;
  if ((arena.data & 1) != 0) {
    arena = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
            ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(arena.data & 0xfffffffffffffffe))->data;
  }
  ptr_00 = (TcParseTableBase *)(ptr + 1);
  if ((Arena *)arena.data == (Arena *)0x0) {
    arena.data = 0;
  }
  puVar4 = (ushort *)
           EpsCopyInputStream::ReadMicroString
                     (&ctx->super_EpsCopyInputStream,(char *)ptr_00,str,(Arena *)arena);
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  ctx_00 = extraout_RDX;
  if (puVar4 != (ushort *)0x0) {
    sVar8 = MicroString::Get(str);
    str_00._M_str = sVar8._M_str;
    str_00._M_len = (size_t)str_00._M_str;
    bVar2 = utf8_range::IsStructurallyValid((utf8_range *)sVar8._M_len,str_00);
    if (bVar2) {
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar4) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar7 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
          *puVar7 = *puVar7 | (uint)hasbits_00;
        }
        return (char *)puVar4;
      }
      uVar3 = (uint)table->fast_idx_mask & (uint)*puVar4;
      if ((uVar3 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar5 = (ulong)(uVar3 & 0xfffffff8);
      pcVar6 = (char *)(**(code **)(&table[1].has_bits_offset + uVar5))
                                 (msg,puVar4,ctx,
                                  (ulong)*puVar4 ^ *(ulong *)(&table[1].fast_idx_mask + uVar5 * 2),
                                  table,hasbits_00);
      return pcVar6;
    }
    ptr_00 = table;
    ReportFastUtf8Error((uint)bVar1,table);
    ctx_00 = extraout_RDX_00;
  }
  pcVar6 = Error(msg,(char *)ptr_00,ctx_00,(TcFieldData)arena,table,hasbits_00);
  return pcVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastUmS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, MicroString, kUtf8>(
      PROTOBUF_TC_PARAM_PASS);
}